

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  int iVar1;
  const_reference pvVar2;
  int i_local;
  TestResult *this_local;
  
  if (-1 < i) {
    iVar1 = total_part_count(this);
    if (i < iVar1) goto LAB_00444cca;
  }
  internal::posix::Abort();
LAB_00444cca:
  pvVar2 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::at
                     (&this->test_part_results_,(long)i);
  return pvVar2;
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(i);
}